

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

Instr * __thiscall
Lowerer::LowerLdFld(Lowerer *this,Instr *ldFldInstr,JnHelperMethod helperMethod,
                   JnHelperMethod polymorphicHelperMethod,bool useInlineCache,
                   LabelInstr *labelBailOut,bool isHelper)

{
  LowererMD *this_00;
  JITTimePolymorphicInlineCache *pJVar1;
  code *pcVar2;
  OpndKind OVar3;
  bool bVar4;
  Instr *pIVar5;
  SymOpnd *this_01;
  Opnd *pOVar6;
  undefined4 *puVar7;
  PropertySymOpnd *pPVar8;
  intptr_t address;
  AddrOpnd *opndArg;
  IntConstOpnd *opndArg_00;
  RegOpnd *opndBailOutArg;
  Lowerer *this_02;
  JnHelperMethod local_34;
  
  if (ldFldInstr->m_kind == InstrKindJitProfiling) {
    pIVar5 = LowerProfiledLdFld(this,(JitProfilingInstr *)ldFldInstr);
    return pIVar5;
  }
  pIVar5 = ldFldInstr->m_prev;
  this_01 = (SymOpnd *)IR::Instr::UnlinkSrc1(ldFldInstr);
  if (ldFldInstr->m_opcode == LdSuperFld) {
    pOVar6 = IR::Instr::UnlinkSrc2(ldFldInstr);
    LowererMD::LoadHelperArgument(&this->m_lowererMD,ldFldInstr,pOVar6);
  }
  OVar3 = IR::Opnd::GetKind((Opnd *)this_01);
  if (OVar3 == OpndKindSym) {
    OVar3 = IR::Opnd::GetKind((Opnd *)this_01);
    if (OVar3 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
      if (!bVar4) goto LAB_005a11f7;
      *puVar7 = 0;
    }
    if (this_01->m_sym->m_kind != SymKindProperty) goto LAB_005a0e67;
  }
  else {
LAB_005a0e67:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x178b,"(src->IsSymOpnd() && src->AsSymOpnd()->m_sym->IsPropertySym())",
                       "Expected property sym as src");
    if (!bVar4) goto LAB_005a11f7;
    *puVar7 = 0;
  }
  local_34 = helperMethod;
  if (useInlineCache) {
    OVar3 = IR::Opnd::GetKind((Opnd *)this_01);
    if (OVar3 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
      if (!bVar4) goto LAB_005a11f7;
      *puVar7 = 0;
    }
    bVar4 = IR::SymOpnd::IsPropertySymOpnd(this_01);
    if (!bVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1790,"(src->AsSymOpnd()->IsPropertySymOpnd())",
                         "Need property sym operand to find the inline cache");
      if (!bVar4) goto LAB_005a11f7;
      *puVar7 = 0;
    }
    pPVar8 = IR::Opnd::AsPropertySymOpnd((Opnd *)this_01);
    pJVar1 = pPVar8->m_runtimePolymorphicInlineCache;
    pPVar8 = IR::Opnd::AsPropertySymOpnd((Opnd *)this_01);
    if ((polymorphicHelperMethod == helperMethod) ||
       (pJVar1 == (JITTimePolymorphicInlineCache *)0x0)) {
      opndArg = (AddrOpnd *)LoadRuntimeInlineCacheOpnd(this,ldFldInstr,pPVar8,isHelper);
    }
    else {
      address = JITTimePolymorphicInlineCache::GetAddr(pPVar8->m_runtimePolymorphicInlineCache);
      opndArg = IR::AddrOpnd::New(address,AddrOpndKindDynamicInlineCache,this->m_func,false,(Var)0x0
                                 );
      local_34 = polymorphicHelperMethod;
    }
    LoadPropertySymAsArgument(this,ldFldInstr,(Opnd *)this_01);
    this_00 = &this->m_lowererMD;
    pPVar8 = IR::Opnd::AsPropertySymOpnd((Opnd *)this_01);
    opndArg_00 = IR::Opnd::CreateInlineCacheIndexOpnd(pPVar8->m_inlineCacheIndex,this->m_func);
    LowererMD::LoadHelperArgument(this_00,ldFldInstr,&opndArg_00->super_Opnd);
    this_02 = (Lowerer *)this_00;
    LowererMD::LoadHelperArgument(this_00,ldFldInstr,&opndArg->super_Opnd);
    pOVar6 = LoadFunctionBodyOpnd(this_02,ldFldInstr);
    LowererMD::LoadHelperArgument(this_00,ldFldInstr,pOVar6);
  }
  else {
    LoadScriptContext(this,ldFldInstr);
    LoadPropertySymAsArgument(this,ldFldInstr,(Opnd *)this_01);
  }
  OVar3 = IR::Opnd::GetKind((Opnd *)this_01);
  if (OVar3 != OpndKindSym) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
    if (!bVar4) goto LAB_005a11f7;
    *puVar7 = 0;
  }
  opndBailOutArg = IR::SymOpnd::CreatePropertyOwnerOpnd(this_01,this->m_func);
  OVar3 = IR::Opnd::GetKind((Opnd *)this_01);
  if (OVar3 != OpndKindSym) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
    if (!bVar4) goto LAB_005a11f7;
    *puVar7 = 0;
  }
  bVar4 = IR::SymOpnd::IsPropertySymOpnd(this_01);
  if (bVar4) {
    OVar3 = IR::Opnd::GetKind((Opnd *)this_01);
    if (OVar3 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
      if (!bVar4) {
LAB_005a11f7:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar7 = 0;
    }
    pPVar8 = IR::Opnd::AsPropertySymOpnd((Opnd *)this_01);
  }
  else {
    pPVar8 = (PropertySymOpnd *)0x0;
  }
  LowererMD::ChangeToHelperCall
            (&this->m_lowererMD,ldFldInstr,local_34,labelBailOut,&opndBailOutArg->super_Opnd,pPVar8,
             isHelper);
  return pIVar5;
}

Assistant:

IR::Instr *
Lowerer::LowerLdFld(
    IR::Instr * ldFldInstr,
    IR::JnHelperMethod helperMethod,
    IR::JnHelperMethod polymorphicHelperMethod,
    bool useInlineCache,
    IR::LabelInstr *labelBailOut,
    bool isHelper)
{
    if (ldFldInstr->IsJitProfilingInstr())
    {
        // If we want to profile then do something completely different
        return this->LowerProfiledLdFld(ldFldInstr->AsJitProfilingInstr());
    }

    IR::Opnd *src;
    IR::Instr *instrPrev = ldFldInstr->m_prev;

    src = ldFldInstr->UnlinkSrc1();
    if (ldFldInstr->m_opcode == Js::OpCode::LdSuperFld)
    {
        IR::Opnd * src2 = nullptr;
        src2 = ldFldInstr->UnlinkSrc2();
        m_lowererMD.LoadHelperArgument(ldFldInstr, src2);
    }

    AssertMsg(src->IsSymOpnd() && src->AsSymOpnd()->m_sym->IsPropertySym(), "Expected property sym as src");

    if (useInlineCache)
    {
        IR::Opnd * inlineCacheOpnd;
        AssertMsg(src->AsSymOpnd()->IsPropertySymOpnd(), "Need property sym operand to find the inline cache");
        if (src->AsPropertySymOpnd()->m_runtimePolymorphicInlineCache && polymorphicHelperMethod != helperMethod)
        {
            JITTimePolymorphicInlineCache * polymorphicInlineCache = src->AsPropertySymOpnd()->m_runtimePolymorphicInlineCache;
            helperMethod = polymorphicHelperMethod;
            inlineCacheOpnd = IR::AddrOpnd::New(polymorphicInlineCache->GetAddr(), IR::AddrOpndKindDynamicInlineCache, this->m_func);
        }
        else
        {
            // Need to load runtime inline cache opnd first before loading any helper argument
            // because LoadRuntimeInlineCacheOpnd may create labels marked as helper,
            // and cause op helper register push/pop save in x86, messing up with any helper arguments that is already pushed
            inlineCacheOpnd = this->LoadRuntimeInlineCacheOpnd(ldFldInstr, src->AsPropertySymOpnd(), isHelper);
        }
        this->LoadPropertySymAsArgument(ldFldInstr, src);
        this-> m_lowererMD.LoadHelperArgument(
            ldFldInstr,
            IR::Opnd::CreateInlineCacheIndexOpnd(src->AsPropertySymOpnd()->m_inlineCacheIndex, m_func));

        this->m_lowererMD.LoadHelperArgument(ldFldInstr, inlineCacheOpnd);
        this->m_lowererMD.LoadHelperArgument(ldFldInstr, LoadFunctionBodyOpnd(ldFldInstr));
    }
    else
    {
        LoadScriptContext(ldFldInstr);
        this->LoadPropertySymAsArgument(ldFldInstr, src);
    }

    // Do we need to reload the type and slot array after the helper returns?
    // (We do if there's a propertySymOpnd downstream that needs it, i.e., the type is not dead.)
    IR::RegOpnd *opndBase = src->AsSymOpnd()->CreatePropertyOwnerOpnd(m_func);
    m_lowererMD.ChangeToHelperCall(ldFldInstr, helperMethod, labelBailOut, opndBase, src->AsSymOpnd()->IsPropertySymOpnd() ? src->AsSymOpnd()->AsPropertySymOpnd() : nullptr, isHelper);

    return instrPrev;
}